

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

void stderr_logger(nng_log_level level,nng_log_facility facility,char *msgid,char *msg,_Bool timechk
                  )

{
  int iVar1;
  char *pcVar2;
  tm *__tp;
  ulong uVar3;
  size_t sVar4;
  undefined7 in_register_00000081;
  char *pcVar5;
  char *pcVar6;
  undefined4 uVar7;
  undefined8 unaff_R12;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  undefined1 local_d0 [8];
  tm tm_buf;
  char when [64];
  time_t now;
  uint64_t local_48;
  uint64_t sec;
  nng_log_facility local_38;
  uint32_t local_34 [2];
  uint32_t nsec;
  
  sec._4_4_ = (undefined4)CONCAT71(in_register_00000081,timechk);
  local_38 = facility;
  iVar1 = nni_time_get(&local_48,local_34);
  if (iVar1 != 0) {
    local_48 = 0;
    local_34[0] = 0;
  }
  when[0x38] = (undefined1)local_48;
  when[0x39] = local_48._1_1_;
  when[0x3a] = local_48._2_1_;
  when[0x3b] = local_48._3_1_;
  when[0x3c] = local_48._4_1_;
  when[0x3d] = local_48._5_1_;
  when[0x3e] = local_48._6_1_;
  when[0x3f] = local_48._7_1_;
  iVar1 = fileno(_stderr);
  iVar1 = isatty(iVar1);
  if ((iVar1 == 0) || (pcVar2 = getenv("TERM"), pcVar2 == (char *)0x0)) {
    uVar7 = 0;
  }
  else {
    uVar7 = (undefined4)CONCAT71((int7)((ulong)unaff_R12 >> 8),*pcVar2 != '\0');
  }
  pcVar2 = getenv("NNG_LOG_NO_COLOR");
  if ((pcVar2 != (char *)0x0) || (pcVar2 = getenv("NO_COLOR"), pcVar2 != (char *)0x0)) {
    uVar7 = 0;
  }
  sec._0_4_ = uVar7;
  __tp = localtime_r((time_t *)(when + 0x38),(tm *)local_d0);
  if (level - NNG_LOG_ERR < 5) {
    uVar3 = (ulong)(level - NNG_LOG_ERR);
    pcVar8 = &DAT_0013d8f0 + *(int *)(&DAT_0013d8f0 + uVar3 * 4);
    pcVar9 = &DAT_0013d904 + *(int *)(&DAT_0013d904 + uVar3 * 4);
    pcVar2 = &DAT_0013d918 + *(int *)(&DAT_0013d918 + uVar3 * 4);
  }
  else {
    pcVar9 = "";
    pcVar8 = "NONE";
    pcVar2 = "";
  }
  if (((sec._4_1_ != '\0') && (NNG_LOG_INFO < log_level)) &&
     ((stderr_logger::last_log.tm_mday != __tp->tm_mday ||
      ((stderr_logger::last_log.tm_mon != __tp->tm_mon ||
       (stderr_logger::last_log.tm_year != __tp->tm_year)))))) {
    strftime((char *)&tm_buf.tm_zone,0x40,"Date changed to %Y-%m-%d, TZ is %z",__tp);
    stderr_logger(NNG_LOG_DEBUG,local_38,"NNG-DATE",(char *)&tm_buf.tm_zone,false);
    stderr_logger::last_log.tm_zone = __tp->tm_zone;
    stderr_logger::last_log.tm_sec = __tp->tm_sec;
    stderr_logger::last_log.tm_min = __tp->tm_min;
    stderr_logger::last_log.tm_hour = __tp->tm_hour;
    stderr_logger::last_log.tm_mday = __tp->tm_mday;
    stderr_logger::last_log.tm_mon = __tp->tm_mon;
    stderr_logger::last_log.tm_year = __tp->tm_year;
    stderr_logger::last_log.tm_wday = __tp->tm_wday;
    stderr_logger::last_log.tm_yday = __tp->tm_yday;
    stderr_logger::last_log.tm_isdst = __tp->tm_isdst;
    stderr_logger::last_log._36_4_ = *(undefined4 *)&__tp->field_0x24;
    stderr_logger::last_log.tm_gmtoff = __tp->tm_gmtoff;
  }
  strftime((char *)&tm_buf.tm_zone,0x40,"%H:%M:%S",__tp);
  sVar4 = strlen(msg);
  if (sVar4 == 0) {
    pcVar5 = "\n";
  }
  else {
    pcVar5 = "\n";
    if (msg[sVar4 - 1] == '\n') {
      pcVar5 = "";
    }
  }
  if ((char)sec == '\0') {
    pcVar2 = "";
    pcVar9 = "";
  }
  bVar10 = msgid == (char *)0x0;
  if (bVar10) {
    msgid = "";
  }
  pcVar6 = ": ";
  if (bVar10) {
    pcVar6 = "";
  }
  fprintf(_stderr,"%s[%-6s]: %s.%03d: %s%s%s%s%s",pcVar2,pcVar8,&tm_buf.tm_zone,
          (ulong)local_34[0] / 1000000,msgid,pcVar6,msg,pcVar9,pcVar5);
  return;
}

Assistant:

void
stderr_logger(nng_log_level level, nng_log_facility facility,
    const char *msgid, const char *msg, bool timechk)
{
	const char *sgr, *sgr0;
	// Initial implementation.
	bool             colors = false;
	const char      *level_str;
	char             when[64];
	struct tm       *tm;
	static struct tm last_log = { 0 };
	time_t           now;
	uint64_t         sec;
	uint32_t         nsec;

	NNI_ARG_UNUSED(facility);

	if (nni_time_get(&sec, &nsec) != 0) {
		// default to the epoch if we can't get a clock for some reason
		sec  = 0;
		nsec = 0;
	}
	now = (time_t) sec;

#ifdef NNG_PLATFORM_WINDOWS
	// NB: We are blithely assuming the user has a modern console.
	colors = _isatty(_fileno(stderr));
#elif defined(NNG_HAVE_SYSLOG)
	// Only assuming we can use colors (and attributes) if stderr is a tty
	// and $TERM is reasonable. We assume the terminal supports ECMA-48,
	// which is true on every reasonable system these days.
	colors = isatty(fileno(stderr)) && (getenv("TERM") != NULL) &&
	    (getenv("TERM")[0] != 0);
#else
	colors = false;
#endif

	// Escape hatch to prevent colorizing logs if we have to.  Users on
	// legacy Windows can set this, or on ancient HP terminals or
	// something.  Also in the same way that no-color.org proposes.
	// The reason for both is to allow suppression *only* for NNG.  There
	// is no good reason to enable it to override the presence of NO_COLOR.
	if ((getenv("NNG_LOG_NO_COLOR") != NULL) ||
	    (getenv("NO_COLOR") != NULL)) {
		colors = false;
	}
#ifdef NNG_HAVE_LOCALTIME_R
	struct tm tm_buf;
	// No timezone offset, not strictly ISO8601 compliant
	tm = localtime_r(&now, &tm_buf);
#else
	tm = localtime(&now);
#endif
	switch (level) {
	case NNG_LOG_ERR:
		sgr       = "\x1b[31m"; // red
		sgr0      = "\x1b[0m";
		level_str = "ERROR";
		break;
	case NNG_LOG_WARN:
		sgr       = "\x1b[33m"; // yellow
		sgr0      = "\x1b[0m";
		level_str = "WARN";
		break;
	case NNG_LOG_NOTICE:
		sgr       = "\x1b[1m"; // bold
		sgr0      = "\x1b[0m";
		level_str = "NOTICE";
		break;
	case NNG_LOG_DEBUG:
		sgr       = "\x1b[36m"; // cyan
		sgr0      = "\x1b[0m";
		level_str = "DEBUG";
		break;
	case NNG_LOG_INFO:
		sgr       = "";
		sgr0      = "";
		level_str = "INFO";
		break;
	default:
		sgr       = "";
		sgr0      = "";
		level_str = "NONE";
		break;
	}

	if (!colors) {
		sgr  = "";
		sgr0 = "";
	}

	if (timechk && (log_level >= NNG_LOG_DEBUG) &&
	    ((last_log.tm_mday != tm->tm_mday) ||
	        (last_log.tm_mon != tm->tm_mon) ||
	        (last_log.tm_year != tm->tm_year))) {
		char new_day[64];
		strftime(new_day, sizeof(new_day),
		    "Date changed to %Y-%m-%d, TZ is %z", tm);
		stderr_logger(
		    NNG_LOG_DEBUG, facility, "NNG-DATE", new_day, false);
		last_log = *tm;
	}

	strftime(when, sizeof(when), "%H:%M:%S", tm);
	// we print with millisecond resolution
	bool trailing_nl =
	    ((strlen(msg) != 0) && msg[strlen(msg) - 1] == '\n');
	(void) fprintf(stderr, "%s[%-6s]: %s.%03d: %s%s%s%s%s", sgr, level_str,
	    when, nsec / 1000000, msgid ? msgid : "", msgid ? ": " : "", msg,
	    sgr0, trailing_nl ? "" : "\n");
}